

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeIncrFree(IncrMerger *pIncr)

{
  long in_RDI;
  
  if (in_RDI != 0) {
    if (*(int *)(in_RDI + 0x20) != 0) {
      vdbeSorterJoinThread((SortSubtask *)pIncr);
      if (*(long *)(in_RDI + 0x28) != 0) {
        sqlite3OsCloseFree((sqlite3_file *)pIncr);
      }
      if (*(long *)(in_RDI + 0x38) != 0) {
        sqlite3OsCloseFree((sqlite3_file *)pIncr);
      }
    }
    vdbeMergeEngineFree((MergeEngine *)pIncr);
    sqlite3_free((void *)0x13b23a);
  }
  return;
}

Assistant:

static void vdbeIncrFree(IncrMerger *pIncr){
  if( pIncr ){
#if SQLITE_MAX_WORKER_THREADS>0
    if( pIncr->bUseThread ){
      vdbeSorterJoinThread(pIncr->pTask);
      if( pIncr->aFile[0].pFd ) sqlite3OsCloseFree(pIncr->aFile[0].pFd);
      if( pIncr->aFile[1].pFd ) sqlite3OsCloseFree(pIncr->aFile[1].pFd);
    }
#endif
    vdbeMergeEngineFree(pIncr->pMerger);
    sqlite3_free(pIncr);
  }
}